

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O2

void __thiscall winmd::reader::EnumDefinition::EnumDefinition(EnumDefinition *this,TypeDef *type)

{
  undefined4 uVar1;
  FieldAttributes FVar2;
  variant_alternative_t<0UL,_variant<ElementType,_coded_index<TypeDefOrRef>,_GenericTypeIndex,_GenericTypeInstSig,_GenericMethodTypeIndex>_>
  *pvVar3;
  uint32_t uVar4;
  table_base *ptVar5;
  Field local_118;
  table_base *local_108;
  EnumDefinition *local_100;
  pair<winmd::reader::Field,_winmd::reader::Field> local_f8;
  FieldSig local_d8;
  
  uVar4 = (type->super_row_base<winmd::reader::TypeDef>).m_index;
  uVar1 = *(undefined4 *)&(type->super_row_base<winmd::reader::TypeDef>).field_0xc;
  (this->m_typedef).super_row_base<winmd::reader::TypeDef>.m_table =
       (type->super_row_base<winmd::reader::TypeDef>).m_table;
  (this->m_typedef).super_row_base<winmd::reader::TypeDef>.m_index = uVar4;
  *(undefined4 *)&(this->m_typedef).super_row_base<winmd::reader::TypeDef>.field_0xc = uVar1;
  this->m_underlying_type = End;
  local_100 = this;
  TypeDef::FieldList(&local_f8,type);
  local_108 = local_f8.first.super_row_base<winmd::reader::Field>.m_table;
  ptVar5 = local_f8.first.super_row_base<winmd::reader::Field>.m_table;
  for (uVar4 = local_f8.first.super_row_base<winmd::reader::Field>.m_index;
      (ptVar5 != local_f8.second.super_row_base<winmd::reader::Field>.m_table ||
      (local_f8.second.super_row_base<winmd::reader::Field>.m_index != uVar4)); uVar4 = uVar4 + 1) {
    local_118.super_row_base<winmd::reader::Field>._12_4_ =
         local_f8.first.super_row_base<winmd::reader::Field>._12_4_;
    local_118.super_row_base<winmd::reader::Field>.m_table = ptVar5;
    local_118.super_row_base<winmd::reader::Field>.m_index = uVar4;
    FVar2 = Field::Flags(&local_118);
    if (((ushort)FVar2.super_AttributesBase<unsigned_short>.value & 0x40) == 0) {
      FVar2 = Field::Flags(&local_118);
      if (((ushort)FVar2.super_AttributesBase<unsigned_short>.value & 0x10) == 0) {
        Field::Signature(&local_d8,&local_118);
        pvVar3 = std::
                 get<0ul,winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>
                           (&local_d8.m_type.m_type);
        local_100->m_underlying_type = *pvVar3;
        FieldSig::~FieldSig(&local_d8);
        ptVar5 = local_108;
      }
    }
  }
  return;
}

Assistant:

explicit EnumDefinition(TypeDef const& type)
            : m_typedef(type)
        {
            XLANG_ASSERT(type.is_enum());
            for (auto field : type.FieldList())
            {
                if (!field.Flags().Literal() && !field.Flags().Static())
                {
                    XLANG_ASSERT(m_underlying_type == ElementType::End);
                    m_underlying_type = std::get<ElementType>(field.Signature().Type().Type());
                    XLANG_ASSERT(ElementType::Boolean <= m_underlying_type && m_underlying_type <= ElementType::U8);
                }
            }
        }